

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int forkal(int ip,int iq,int id,double *phi,double *theta,double *delta,int N,double *W,
          double *resid,int il,double *Y,double *AMSE)

{
  size_t __size;
  size_t __size_00;
  double dVar1;
  double dVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  void *pvVar13;
  double *pdVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  double dVar22;
  double extraout_XMM0_Qa;
  double dVar23;
  double local_1a0;
  double sumlog;
  double ssq;
  int nit;
  int iter;
  double *local_180;
  ulong local_178;
  ulong local_170;
  double local_168;
  long local_160;
  long local_158;
  long local_150;
  double *local_148;
  double *local_140;
  long local_138;
  long local_130;
  double *local_128;
  double *local_120;
  ulong local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  void *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  double *local_e0;
  void *local_d8;
  ulong local_d0;
  double *local_c8;
  long local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  ulong local_a8;
  double local_a0;
  double *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double *local_70;
  uint local_64;
  double *local_60;
  uint local_54;
  double *local_50;
  ulong local_48;
  double local_40;
  double *local_38;
  
  local_a8 = (ulong)(uint)id;
  local_48 = (ulong)(uint)iq;
  local_78 = (ulong)(iq + 1U);
  if ((int)(iq + 1U) <= ip) {
    local_78 = (ulong)(uint)ip;
  }
  iVar8 = (int)local_78;
  local_88 = (ulong)(iVar8 + 1U);
  local_40 = (double)((long)(int)((iVar8 + 1U) * iVar8) / 2 & 0xffffffff);
  local_64 = iVar8 + id;
  local_ac = iVar8 + id + 1;
  uVar3 = (long)(int)(local_ac * local_64) / 2;
  iVar8 = (iq >> 0x1f) * -2 - (ip >> 0x1f);
  if (iq * iq == 0 && ip * ip == 0) {
    iVar8 = 4;
  }
  iVar12 = 8;
  if (-1 < id) {
    iVar12 = iVar8;
  }
  local_e4 = 0xb;
  if (0 < il) {
    local_e4 = iVar12;
  }
  if (local_e4 == 0) {
    local_d0 = (ulong)(int)local_64;
    __size = local_d0 * 8;
    local_70 = phi;
    local_60 = delta;
    local_54 = ip;
    local_50 = theta;
    local_98 = (double *)malloc(__size);
    iVar8 = (int)uVar3;
    local_90 = (ulong)iVar8;
    local_38 = (double *)malloc(local_90 * 8);
    local_80 = (ulong)local_40._0_4_;
    __size_00 = local_80 * 8;
    local_c8 = (double *)malloc(__size_00);
    __ptr = malloc(__size);
    local_f8 = __ptr;
    local_d8 = malloc(__size_00);
    uVar21 = local_a8;
    uVar7 = 0;
    uVar4 = 0;
    if (0 < (int)local_d0) {
      uVar4 = (ulong)local_64;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      local_98[uVar7] = 0.0;
      *(undefined8 *)((long)__ptr + uVar7 * 8) = 0;
    }
    uVar4 = 0;
    uVar3 = uVar3 & 0xffffffff;
    if (iVar8 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      local_38[uVar4] = 0.0;
    }
    uVar4 = 0;
    uVar3 = (ulong)local_40 & 0xffffffff;
    if (SUB84(local_40,0) < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      local_c8[uVar4] = 0.0;
      *(undefined8 *)((long)local_d8 + uVar4 * 8) = 0;
    }
    *local_98 = 0.0;
    *local_c8 = 1.0;
    if ((int)local_78 == 1) {
      dVar22 = *local_70 * *local_70;
      *local_38 = 1.0 / (1.0 - dVar22);
    }
    else {
      starma(local_54,(int)local_48,local_70,local_50,local_98,local_38,local_c8);
      dVar22 = extraout_XMM0_Qa;
    }
    iVar8 = (int)uVar21;
    uVar19 = N - iVar8;
    local_c0 = (long)iVar8;
    if (iVar8 == 0) {
      local_40 = 0.0;
      if (0 < (int)uVar19) {
        local_40 = (double)(ulong)uVar19;
      }
    }
    else {
      uVar3 = 1;
      uVar7 = 0;
      uVar4 = 0;
      if (0 < iVar8) {
        uVar4 = uVar21 & 0xffffffff;
      }
      iVar8 = N + -2;
      for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        dVar22 = W[iVar8];
        *(double *)((long)__ptr + uVar7 * 8) = dVar22;
        iVar8 = iVar8 + -1;
      }
      local_40 = (double)0;
      if (0 < (int)uVar19) {
        local_40 = (double)(ulong)uVar19;
      }
      lVar11 = (local_c0 << 0x20) + -0x100000000;
      for (; uVar3 != SUB84(local_40,0) + 1; uVar3 = uVar3 + 1) {
        dVar22 = 0.0;
        lVar17 = lVar11;
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          dVar22 = dVar22 - local_60[uVar7] * *(double *)((long)W + (lVar17 >> 0x1d));
          lVar17 = lVar17 + -0x100000000;
          uVar21 = local_a8;
        }
        dVar22 = dVar22 + W[local_c0 + uVar3 + -1];
        W[uVar3 - 1] = dVar22;
        lVar11 = lVar11 + 0x100000000;
      }
    }
    sumlog = 0.0;
    local_1a0 = 0.0;
    ssq._0_4_ = 0;
    ssq._4_4_ = 0;
    karma(local_54,(int)local_48,local_70,&local_1a0,local_98,local_38,local_c8,uVar19,W,resid,
          &local_1a0,&sumlog,1,dVar22,(int *)((long)&ssq + 4),(int *)&ssq);
    local_a0 = 0.0;
    iVar8 = (int)local_78;
    for (uVar3 = 0; ((ulong)local_40 & 0xffffffff) != uVar3; uVar3 = uVar3 + 1) {
      local_a0 = local_a0 + resid[uVar3] * resid[uVar3];
    }
    local_48 = (ulong)iVar8;
    if ((int)uVar21 == 0) {
      local_40 = 0.0;
      if (0 < iVar8) {
        local_40 = (double)(local_78 & 0xffffffff);
      }
      uVar9 = SUB84(local_40,0) + 1;
      local_50 = (double *)0x1;
    }
    else {
      uVar10 = 1;
      for (lVar11 = 1; lVar11 <= (long)local_80; lVar11 = lVar11 + 1) {
        *(double *)((long)local_d8 + lVar11 * 8 + -8) = local_38[lVar11 + -1];
      }
      for (lVar11 = 1; lVar11 <= (long)local_90; lVar11 = lVar11 + 1) {
        local_38[lVar11 + -1] = 0.0;
      }
      iVar12 = 0;
      local_40 = 0.0;
      if (0 < iVar8) {
        local_40 = (double)(local_78 & 0xffffffff);
      }
      uVar9 = SUB84(local_40,0) + 1;
      uVar4 = local_78 & 0xffffffff;
      iVar20 = 0;
      uVar3 = local_78;
      iVar15 = iVar8;
      for (; iVar15 = iVar15 + -1, uVar10 != uVar9; uVar10 = uVar10 + 1) {
        for (lVar11 = 0; (long)(int)uVar4 - (long)iVar12 != lVar11; lVar11 = lVar11 + 1) {
          local_38[((int)((uVar10 - 1) * uVar10) / -2 + iVar20) + lVar11] =
               *(double *)((long)local_d8 + lVar11 * 8 + (long)iVar12 * 8);
        }
        iVar20 = iVar20 + local_ac;
        uVar4 = (ulong)(uint)((int)uVar4 + iVar15);
        iVar12 = iVar12 + (int)uVar3;
        uVar3 = (ulong)((int)uVar3 - 1);
        uVar21 = local_a8;
      }
      uVar3 = 0;
      uVar4 = 0;
      if (0 < (int)uVar21) {
        uVar4 = uVar21 & 0xffffffff;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        local_98[local_48 + uVar3] = *(double *)((long)__ptr + uVar3 * 8);
      }
      local_50 = (double *)(ulong)((int)uVar4 + 1);
    }
    local_a0 = local_a0 / (double)(int)uVar19;
    iVar12 = (int)uVar21;
    local_e8 = iVar12 * 2 + 1;
    uVar4 = (ulong)(iVar12 * 2 + 2);
    uVar19 = (int)local_d0 * 2;
    local_108 = (ulong)uVar19;
    local_b4 = (int)local_d0 * 2 + 1;
    uVar3 = (long)(((int)local_88 + iVar12 * 2) * iVar8) / 2;
    local_ec = uVar19 + 2;
    local_b0 = ((local_b4 - iVar8) * iVar8) / 2;
    local_170 = 0;
    if (0 < (int)local_54) {
      local_170 = (ulong)local_54;
    }
    local_64 = local_64 + 2;
    if (il < 1) {
      il = 0;
    }
    local_178 = (ulong)(il + 1);
    local_80 = (ulong)uVar9;
    local_168 = local_40;
    local_150 = -(uVar21 & 0xffffffff);
    local_148 = local_98 + local_d0;
    local_160 = (local_88 & 0xffffffff) - 1;
    local_f8 = (void *)((long)local_f8 + 8);
    local_90._0_4_ = (int)uVar3;
    local_110 = (long)(int)local_90;
    local_d0 = (ulong)(iVar12 + 1);
    local_118 = local_78 & 0xffffffff;
    local_120 = local_98 + local_48;
    local_e0 = local_38 + local_48;
    lVar11 = (long)local_50 - 1;
    local_140 = local_38 + -2;
    _nit = local_80 - 1;
    local_138 = local_108 - 1;
    local_158 = local_118 - 1;
    local_130 = uVar4 - 1;
    local_180 = local_38 + 1;
    local_128 = local_60 + 1;
    uVar7 = 1;
    pdVar14 = local_70;
    local_90 = uVar3 & 0xffffffff;
    local_88 = uVar4;
    while (uVar7 != local_178) {
      dVar22 = *local_98;
      if ((int)local_78 != 1) {
        for (lVar17 = 1; lVar17 < (long)local_48; lVar17 = lVar17 + 1) {
          local_98[lVar17 + -1] = local_98[lVar17];
        }
      }
      local_98[local_48 + -1] = 0.0;
      if (local_54 != 0) {
        for (uVar3 = 0; local_170 != uVar3; uVar3 = uVar3 + 1) {
          local_98[uVar3] = pdVar14[uVar3] * dVar22 + local_98[uVar3];
        }
      }
      pdVar6 = pdVar14;
      local_100 = uVar7;
      if ((int)uVar21 != 0) {
        for (uVar3 = 1; local_50 != (double *)uVar3; uVar3 = uVar3 + 1) {
          dVar22 = dVar22 + local_60[uVar3 - 1] * local_120[uVar3 - 1];
        }
        if (1 < (int)uVar21) {
          for (lVar17 = -1; local_150 != lVar17; lVar17 = lVar17 + -1) {
            local_148[lVar17] = local_148[lVar17 + -1];
          }
        }
        local_98[local_48] = dVar22;
        for (uVar3 = 1; uVar4 = 2, (double *)uVar3 != local_50; uVar3 = uVar3 + 1) {
          *(undefined8 *)((long)__ptr + uVar3 * 8 + -8) = 0;
          dVar22 = 0.0;
          for (uVar21 = 1; local_d0 != uVar21; uVar21 = uVar21 + 1) {
            local_40 = dVar22;
            iVar8 = imax((int)uVar3,(int)uVar21);
            iVar12 = imin((int)uVar3,(int)uVar21);
            dVar22 = local_40 +
                     local_60[uVar21 - 1] *
                     local_38[((iVar8 + (int)local_90) - iVar12) +
                              (((int)local_88 - iVar12) * (iVar12 + -1)) / 2];
            *(double *)((long)__ptr + uVar3 * 8 + -8) = dVar22;
            local_40 = dVar22;
          }
          uVar21 = local_a8;
        }
        iVar8 = (int)uVar21;
        if (iVar8 != 1) {
          iVar12 = 1;
          while( true ) {
            iVar15 = iVar8 - iVar12;
            iVar20 = (int)local_90;
            if (iVar15 == 0 || iVar8 < iVar12) break;
            for (lVar17 = 0; iVar12 != (int)lVar17; lVar17 = lVar17 + 1) {
              local_38[(((local_e8 - iVar15) * iVar15) / 2 + iVar20) + lVar17] =
                   local_38[((((int)local_88 - iVar15) * (iVar15 + -1)) / 2 + iVar20) + lVar17];
            }
            iVar12 = iVar12 + 1;
          }
          for (lVar17 = 1; lVar17 < local_c0; lVar17 = lVar17 + 1) {
            local_38[iVar20 + (int)lVar17] =
                 *(double *)((long)__ptr + lVar17 * 8 + -8) + local_e0[lVar17 + -1];
          }
        }
        dVar22 = *local_38;
        local_38[local_110] = dVar22;
        for (uVar3 = 1; local_50 != (double *)uVar3; uVar3 = uVar3 + 1) {
          dVar22 = dVar22 + (local_e0[uVar3 - 1] + local_e0[uVar3 - 1] +
                            *(double *)((long)__ptr + uVar3 * 8 + -8)) * local_60[uVar3 - 1];
          local_38[local_110] = dVar22;
        }
        for (uVar3 = 1; local_50 != (double *)uVar3; uVar3 = uVar3 + 1) {
          *(double *)((long)__ptr + uVar3 * 8 + -8) = local_e0[uVar3 - 1];
        }
        for (uVar3 = 1; uVar3 != local_80; uVar3 = uVar3 + 1) {
          uVar19 = (uint)uVar3;
          iVar12 = (int)((uVar19 - 1) * ((int)local_108 - uVar19)) / 2 + (int)local_78;
          for (lVar17 = 0; lVar11 != lVar17; lVar17 = lVar17 + 1) {
            dVar22 = local_70[uVar3 - 1] * *(double *)((long)__ptr + lVar17 * 8);
            local_38[iVar12 + lVar17] = dVar22;
            if (uVar3 != local_118) {
              local_38[iVar12 + lVar17] =
                   dVar22 + local_38[((int)((~uVar19 + (int)local_108) * uVar19) / 2 + (int)local_78
                                     ) + lVar17];
            }
          }
        }
        for (uVar3 = 1; uVar3 != local_80; uVar3 = uVar3 + 1) {
          *(undefined8 *)((long)__ptr + uVar3 * 8 + -8) = 0;
          dVar22 = 0.0;
          for (lVar17 = 0; lVar11 != lVar17; lVar17 = lVar17 + 1) {
            dVar22 = dVar22 + local_60[lVar17] *
                              local_38[(((local_b4 - (int)uVar3) * (int)uVar3) / 2 - iVar8) + lVar17
                                      ];
            *(double *)((long)__ptr + uVar3 * 8 + -8) = dVar22;
          }
        }
        if (iVar8 != 1) {
          iVar12 = 4;
          uVar19 = local_64;
          for (iVar15 = 1; iVar15 != (int)local_80; iVar15 = iVar15 + 1) {
            pdVar14 = local_140 + (int)(uVar19 - (int)(uVar4 >> 1));
            for (iVar20 = 1; iVar20 < iVar8; iVar20 = iVar20 + 1) {
              *pdVar14 = pdVar14[-1];
              pdVar14 = pdVar14 + -1;
            }
            uVar19 = uVar19 + local_ac;
            uVar4 = (ulong)(uint)((int)uVar4 + iVar12);
            iVar12 = iVar12 + 2;
          }
        }
        lVar17 = local_138;
        lVar16 = 0;
        while (pdVar6 = local_70, _nit != lVar16) {
          dVar22 = local_70[lVar16] * *local_38 + *(double *)((long)__ptr + lVar16 * 8);
          iVar8 = ((int)lVar16 * (int)lVar17) / 2 + (int)local_78;
          local_38[iVar8] = dVar22;
          if (lVar16 + 1 < (long)local_48) {
            local_38[iVar8] = dVar22 + local_38[lVar16 + 1];
          }
          lVar17 = lVar17 + -1;
          lVar16 = lVar16 + 1;
        }
      }
      for (dVar22 = 0.0; local_168 != dVar22; dVar22 = (double)((long)dVar22 + 1)) {
        *(double *)((long)__ptr + (long)dVar22 * 8) = local_38[(long)dVar22];
      }
      dVar22 = *local_38;
      lVar18 = 0;
      lVar17 = local_158;
      pvVar13 = local_f8;
      lVar16 = local_160;
      pdVar14 = pdVar6;
      for (uVar3 = 1; uVar3 != local_80; uVar3 = uVar3 + 1) {
        iVar8 = (int)uVar3;
        dVar1 = pdVar14[uVar3 - 1];
        iVar12 = ((iVar8 + -1) * (local_ec - iVar8)) / 2;
        uVar4 = (long)((local_b4 - iVar8) * iVar8) / 2 & 0xffffffff;
        for (lVar5 = 0; lVar16 != lVar5; lVar5 = lVar5 + 1) {
          dVar2 = pdVar6[lVar5];
          dVar23 = dVar2 * dVar22 * dVar1 + local_c8[(int)lVar18 + lVar5];
          local_38[iVar12 + lVar5] = dVar23;
          if ((long)uVar3 < (long)local_48) {
            dVar23 = dVar23 + dVar2 * *(double *)((long)__ptr + uVar3 * 8);
            local_38[iVar12 + lVar5] = dVar23;
          }
          if (lVar17 != lVar5) {
            iVar8 = (int)uVar4;
            uVar4 = (ulong)(iVar8 + 1);
            local_38[iVar12 + lVar5] =
                 dVar23 + *(double *)((long)pvVar13 + lVar5 * 8) * dVar1 + local_38[iVar8];
            uVar21 = local_a8;
          }
        }
        lVar16 = lVar16 + -1;
        pvVar13 = (void *)((long)pvVar13 + 8);
        pdVar6 = pdVar6 + 1;
        lVar17 = lVar17 + -1;
        lVar18 = (int)lVar18 + lVar5;
        pdVar14 = local_70;
      }
      dVar22 = *local_98;
      Y[local_100 - 1] = dVar22;
      iVar8 = (int)uVar21;
      if (iVar8 == 0) {
        dVar22 = *local_38;
      }
      else {
        for (uVar3 = 1; local_50 != (double *)uVar3; uVar3 = uVar3 + 1) {
          dVar22 = dVar22 + local_120[uVar3 - 1] * local_60[uVar3 - 1];
          Y[local_100 - 1] = dVar22;
        }
        dVar22 = *local_38;
        lVar17 = local_130;
        for (lVar16 = 0; lVar11 != lVar16; lVar16 = lVar16 + 1) {
          dVar1 = local_60[lVar16];
          dVar22 = dVar22 + (dVar1 + dVar1) * local_e0[lVar16] +
                            local_38[((int)lVar16 * (int)lVar17) / 2 + local_b0] * dVar1 * dVar1;
          lVar17 = lVar17 + -1;
        }
        if (iVar8 != 1) {
          iVar12 = 2;
          pdVar6 = local_128;
          for (lVar17 = 1; lVar17 < local_c0; lVar17 = lVar17 + 1) {
            for (lVar16 = 0; iVar12 + (int)lVar16 <= iVar8; lVar16 = lVar16 + 1) {
              dVar22 = dVar22 + (pdVar6[lVar16] + pdVar6[lVar16]) * local_60[lVar17 + -1] *
                                local_180[((((int)lVar17 + -1) * ((int)local_88 - (int)lVar17)) / 2
                                          + local_b0) + lVar16];
            }
            iVar12 = iVar12 + 1;
            pdVar6 = pdVar6 + 1;
          }
        }
      }
      AMSE[local_100 - 1] = dVar22 * local_a0;
      uVar7 = local_100 + 1;
    }
    free(local_98);
    free(local_38);
    free(local_c8);
    free(__ptr);
    free(local_d8);
  }
  return local_e4;
}

Assistant:

int forkal(int ip,int iq,int id,double *phi,double*theta,double *delta,int N,double *W,double *resid,int il,double *Y,double *AMSE) {
	int ifault,ir,np,k,nrbar,ird,irz;
	double *A,*P,*V,*store,*xrow;
	double zero, one, two,AA,del,sumlog,ssq,sigma,A1,dt,phij,phijdt,phii,AMS;
	int i,  j, ll, nt, nj, idk, iid,iupd,nit,iter,ind,irj;
	int ir2, ir1, id2r, id2r1, id1,idd1,idd2,i45,idrr1,iddr,jkl,jkl1,id2r2,ibc,l,iri1,jj;
	int lk, lk1,jklj,iri,kk1,k1,kk,kkk,ind1,ind2,jrj,j1,jrk;
	/*
C     C Translation of Fortran routine
C     ALGORITHM AS 182  APPL. STATIST. (1982) VOL.31, NO.2
C
C     Finite sample prediction from ARIMA processes.
C
C     Auxiliary routines required: KARMA & STARMA from AS 154 and
C     routines called by them: INCLU2 from ASR 17 (a slight variant on
C     AS 75, and REGRES from AS 75.
C*/
	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}
	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;
	ird = ir + id;
	irz = (ird * (ird + 1)) / 2;
	zero = 0.0;
	one = 1.0;
	two = 2.0;

	ifault = 0;

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = ifault + 2;
	}
	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}
	if (id < 0) {
		ifault = 8;
	}
	if (il < 1) {
		ifault = 11;
	}
	if (ifault != 0) {
		return ifault;
	}

	A = (double*)malloc(sizeof(double)* ird);
	P = (double*)malloc(sizeof(double)* irz);
	V = (double*)malloc(sizeof(double)* np); 
	store = (double*)malloc(sizeof(double)* ird);
	xrow = (double*)malloc(sizeof(double)* np);

	//Initial Conditions for Kalman Filter

	for (i = 0; i < ird; ++i) {
		A[i] = zero;
		store[i] = zero;
	}
	for (i = 0; i < irz; ++i) {
		P[i] = zero;
	}
	for (i = 0; i < np; ++i) {
		V[i] = zero;
		xrow[i] = zero;
	}
	A[0] = zero;
	V[0] = one;
	/*

	if (np != 1) {
		for (i = 2; i <= np; ++i) {
			V[i-1] = zero;
		}
		if (iq != 0) {
			iq1 = iq + 1;
			for (i = 2; i <= iq1; ++i) {
				V[i-1] = theta[i - 2];
			}
			for (j = 1; j <= iq; ++j) {
				ll = j * (2 * ir + 1 - j) / 2;
				for (i = j; i <= iq; ++i) {
					lli = ll + i;
					V[lli-1] = theta[i-1] * theta[j-1]; // Error
				}
			}
		}
	}//130
*/
	//Find initial likelihood conditions.

	if (ir == 1) {
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		starma(ip, iq, phi, theta,A, P, V);
	}

	//Calculate Data Transformations

	nt = N - id;

	if (id != 0) {
		for (j = 1; j <= id; ++j) {
			nj = N - j;
			store[j-1] = W[nj-1];
		}
		for (i = 1; i <= nt; ++i) {
			AA = zero;
			for (k = 1; k <= id; ++k) {
				idk = id + i - k;
				AA -= delta[k - 1] * W[idk - 1];
			}
			iid = i + id;
			W[i - 1] = W[iid - 1] + AA;
		}
	}//170

	//Evaluate likelihood to obtain final KF conditions
	sumlog = ssq = zero;
	del = -1.0;
	iupd = 1;
	nit = 0;
	iter = 0;

	karma(ip, iq, phi, theta, A, P, V, nt, W, resid, &sumlog, &ssq, iupd, del,&iter, &nit);

	//Calculate M.L.E. of sigma squared

	sigma = zero;

	for (j = 0; j < nt; ++j) {
		sigma += resid[j] * resid[j];
	}
	sigma = sigma / nt;
	//mdisplay(resid, 1, N);

	//Reset the initial A and P when differencing occurs

	if (id != 0) {
		for (i = 1; i <= np; ++i) {
			xrow[i-1] = P[i-1];
		}
		for (i = 1; i <= irz; ++i) {
			P[i-1] = zero;
		}
		ind = 0;
		for (j = 1; j <= ir; ++j) {
			k = (j - 1) * (id + ir + 1) - (j - 1) * j / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				k++;
				P[k - 1] = xrow[ind-1];
			}
		}

		for (j = 1; j <= id; ++j) {
			irj = ir + j;
			A[irj-1] = store[j-1];
		}

	}//250

	//Set up constants
	ir2 = ir + 1;
	ir1 = ir - 1;
	id1 = id - 1;
	id2r = 2 * ird;
	id2r1 = id2r - 1;
	idd1 = 2 * id + 1;
	idd2 = idd1 + 1;
	i45 = id2r + 1;
	idrr1 = ird + 1;
	iddr = 2 * id + ir;
	jkl = ir * (iddr + 1) / 2;
	jkl1 = jkl + 1;
	id2r2 = id2r + 2;
	ibc = ir * (i45 - ir) / 2;

	for (l = 1; l <= il; ++l) {
		//Predict A
		A1 = A[0];
		if (ir != 1) {
			for (i = 1; i <= ir1; ++i) {
				A[i-1] = A[i];
			}
		}//310
		A[ir-1] = zero;
		if (ip != 0) {
			for (j = 1; j <= ip; ++j) {
				A[j-1] += phi[j-1] * A1;
			}
		}//330
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				A1 += delta[j-1] * A[irj-1];
			}//340
			if (id >= 2) {
				for (i = 1; i <= id1; ++i) {
					iri1 = ird - i;
					A[iri1] = A[iri1-1];
				}
			}//360
			A[ir2 - 1] = A1;
		}//360

		//A[ir2-1] = A1;

		//Predict P

		if (id != 0) {
			for (i = 1; i <= id; ++i) {
				store[i-1] = zero;
				for (j = 1; j <= id; ++j) {
					ll = imax(i, j);
					k = imin(i, j);
					jj = jkl + (ll - k) + 1 + (k - 1) * (idd2 - k) / 2;
					store[i-1] += delta[j-1] * P[jj-1];
				}
			}//370

			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					jj = id - j;
					lk = (jj - 1) * (idd2 - jj) / 2 + jkl;
					lk1 = jj * (idd1 - jj) / 2 + jkl;
					for (i = 1; i <= j; ++i) {
						lk = lk + 1;
						lk1 = lk1 + 1;
						P[lk1-1] = P[lk-1];
					}
				}//380
				for (j = 1; j <= id1; ++j) {
					jklj = jkl1 + j;
					irj = ir + j;
					P[jklj - 1] = store[j - 1] + P[irj-1];
				}
			}//400

			P[jkl1 - 1] = P[0];

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				P[jkl1 - 1] += delta[i - 1] * (store[i - 1] + two * P[iri - 1]);
			}

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				store[i - 1] = P[iri - 1];
			}

			for (j = 1; j <= ir; ++j) {
				kk1 = j * (id2r1 - j) / 2 + ir;
				k1 = (j - 1) * (id2r - j) / 2 + ir;
				for (i = 1; i <= id; ++i) {
					kk = kk1 + i;
					k = k1 + i;
					P[k - 1] = phi[j - 1] * store[i - 1];
					if (j != ir) {
						P[k - 1] += P[kk - 1];
					}
				}
			}

			for (j = 1; j <= ir; ++j) {
				store[j - 1] = zero;
				kkk = j * (i45 - j) / 2 - id;
				for (i = 1; i <= id; ++i) {
					kkk++;
					store[j - 1] += delta[i - 1] * P[kkk - 1];
				}
			}//440

			if (id != 1) {
				for (j = 1; j <= ir; ++j) {
					k = j * idrr1 - j * (j + 1) / 2 + 1;
					for (i = 1; i <= id1; ++i) {
						k--;
						P[k - 1] = P[k - 2];
					}
				}
			}//460

			for (j = 1; j <= ir; ++j) {
				k = (j - 1) * (id2r - j) / 2 + ir + 1;
				P[k - 1] = store[j - 1] + phi[j - 1] * P[0];
				if (j < ir) {
					P[k - 1] += P[j];
				}
			}

		}//480

		for (i = 0; i < ir; ++i) {
			store[i] = P[i];
		}

		ind = 0;
		dt = P[0];
		for (j = 1; j <= ir; ++j) {
			phij = phi[j - 1];
			phijdt = phij * dt;
			ind2 = (j - 1) * (id2r2 - j) / 2;
			ind1 = j * (i45 - j) / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				ind2++;
				phii = phi[i - 1];
				P[ind2 - 1] = V[ind - 1] + phii * phijdt;
				if (j < ir) {
					P[ind2 - 1] += store[j] * phii;
				}
				if (i != ir) {
					ind1++;
					P[ind2 - 1] += store[i] * phij + P[ind1 - 1];
				}//500
			}
		}//500

		//Predict Y

		Y[l - 1] = A[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				Y[l - 1] += A[irj - 1] * delta[j - 1];
			}
			//Calculate MSE of Y
		}//520
		AMS = P[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				jrj = ibc + (j - 1) * (idd2 - j) / 2;
				irj = ir + j;
				AMS += (two * delta[j - 1] * P[irj - 1] + P[jrj] * delta[j - 1] * delta[j - 1]);
			}
			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					j1 = j + 1;
					jrk = ibc + 1 + (j - 1) * (idd2 - j) / 2;
					for (i = j1; i <= id; ++i) {
						jrk++;
						AMS += two * delta[i-1] * delta[j-1] * P[jrk-1];
					}
				}
			}//550
		}//550
		AMSE[l - 1] = AMS * sigma;

	}//560
	/*
	mdisplay(A, 1, ird);
	mdisplay(P, 1, irz);
	mdisplay(V, 1, np);
	mdisplay(store, 1, ird);
	mdisplay(xrow, 1, np);
	*/
	free(A);
	free(P);
	free(V);
	free(store);
	free(xrow);
	return ifault;
}